

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int BrotliDecoderSetParameter
              (BrotliDecoderStateInternal *state,BrotliDecoderParameter p,uint32_t value)

{
  ushort uVar1;
  ushort uVar2;
  
  if (state->state != BROTLI_STATE_UNINITED) {
    return 0;
  }
  if (p == BROTLI_DECODER_PARAM_SAVE_INFO) {
    uVar1 = (ushort)(value != 0) << 6;
    uVar2 = (ushort)*(undefined4 *)&state->field_0x338 & 0xffbf;
  }
  else if (p == BROTLI_DECODER_PARAM_LARGE_WINDOW) {
    uVar1 = (ushort)(value != 0) << 5;
    uVar2 = (ushort)*(undefined4 *)&state->field_0x338 & 0xffdf;
  }
  else {
    if (p != BROTLI_DECODER_PARAM_DISABLE_RING_BUFFER_REALLOCATION) {
      return 0;
    }
    uVar1 = (ushort)(value == 0) << 4;
    uVar2 = (ushort)*(undefined4 *)&state->field_0x338 & 0xffef;
  }
  *(ushort *)&state->field_0x338 = uVar2 | uVar1;
  return 1;
}

Assistant:

BROTLI_BOOL BrotliDecoderSetParameter(
    BrotliDecoderState* state, BrotliDecoderParameter p, uint32_t value) {
  if (state->state != BROTLI_STATE_UNINITED) return BROTLI_FALSE;
  switch (p) {
    case BROTLI_DECODER_PARAM_DISABLE_RING_BUFFER_REALLOCATION:
      state->canny_ringbuffer_allocation = !!value ? 0 : 1;
      return BROTLI_TRUE;

    case BROTLI_DECODER_PARAM_LARGE_WINDOW:
      state->large_window = TO_BROTLI_BOOL(!!value);
      return BROTLI_TRUE;

    case BROTLI_DECODER_PARAM_SAVE_INFO:
     state->save_info_for_recompression = TO_BROTLI_BOOL(!!value);
     return BROTLI_TRUE;

    default: return BROTLI_FALSE;
  }
}